

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O1

void not_found(int client)

{
  int iVar1;
  char *local_20;
  char *buffer;
  
  local_20 = (char *)0x0;
  iVar1 = asprintf(&local_20,"HTTP/1.0 404 NOT FOUND\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"Server: dinohttp/0.1\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"Content-Type: text/html\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"<HTML><TITLE>Not Found</TITLE>\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"<BODY><P>The server could not fulfill\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"your request because the resource specified\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"is unavailable or nonexistent.\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"</BODY></HTML>\r\n");
  send_free(client,&local_20,iVar1);
  return;
}

Assistant:

void not_found(int client) {
    char *buffer = NULL;

    int bytes = asprintf(&buffer, "HTTP/1.0 404 NOT FOUND\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, DINO_VERSION);
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "Content-Type: text/html\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "<HTML><TITLE>Not Found</TITLE>\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "<BODY><P>The server could not fulfill\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "your request because the resource specified\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "is unavailable or nonexistent.\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "</BODY></HTML>\r\n");
    send_free(client, &buffer, bytes);;
}